

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * qUncompress(QByteArray *__return_storage_ptr__,uchar *data,qsizetype nbytes)

{
  uint uVar1;
  function_ref<int_(z_stream_s_*)_const> init;
  function_ref<int_(z_stream_s_*,_unsigned_long)_const> processChunk;
  function_ref<void_(z_stream_s_*)_const> deinit;
  ulong capacity;
  long in_FS_OFFSET;
  QByteArrayView input;
  QArrayData *d;
  ThunkPtr in_stack_ffffffffffffff90;
  undefined1 local_61;
  ThunkPtr local_60;
  code *pcStack_58;
  undefined1 local_49;
  QArrayDataPointer<char> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (data == (uchar *)0x0) {
    qUncompress();
  }
  else if (nbytes < 0) {
    qUncompress();
  }
  else if ((ulong)nbytes < 4) {
    qUncompress();
  }
  else {
    uVar1 = *(uint *)data;
    if (nbytes == 4) {
      if (uVar1 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char *)0x0;
          (__return_storage_ptr__->d).size = 0;
          return __return_storage_ptr__;
        }
        goto LAB_0030055c;
      }
      qUncompress();
    }
    else {
      capacity = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18);
      if (capacity <= (ulong)nbytes) {
        capacity = nbytes;
      }
      local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (char *)QArrayData::allocate1(&local_30,capacity,KeepSize);
      local_48.d = (Data *)local_30;
      local_48.size = 0;
      local_60 = (ThunkPtr)&local_61;
      pcStack_58 = anon_func::anon_class_1_0_00000001::__invoke;
      init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.m_thunk_ptr =
           (ThunkPtr)&local_49;
      init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.m_bound_entity.fun =
           anon_func::anon_class_1_0_00000001::__invoke;
      processChunk.super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>.
      m_thunk_ptr = local_60;
      processChunk.super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>.
      m_bound_entity.fun = anon_func::anon_class_1_0_00000001::__invoke;
      deinit.super_function_ref_base<false,_const_void,_void,_z_stream_s_*>.m_thunk_ptr =
           in_stack_ffffffffffffff90;
      deinit.super_function_ref_base<false,_const_void,_void,_z_stream_s_*>.m_bound_entity.fun =
           anon_func::anon_class_1_0_00000001::__invoke;
      input.m_data = (storage_type *)(data + 4);
      input.m_size = nbytes + -4;
      xxflate(__return_storage_ptr__,Decompression,&local_48,input,init,processChunk,deinit);
      if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d)->super_QArrayData,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_0030055c:
  __stack_chk_fail();
}

Assistant:

QByteArray qUncompress(const uchar* data, qsizetype nbytes)
{
    if (!data)
        return dataIsNull(ZLibOp::Decompression);

    if (nbytes < 0)
        return lengthIsNegative(ZLibOp::Decompression);

    constexpr qsizetype HeaderSize = sizeof(CompressSizeHint_t);
    if (nbytes < HeaderSize)
        return invalidCompressedData();

    const auto expectedSize = qFromBigEndian<CompressSizeHint_t>(data);
    if (nbytes == HeaderSize) {
        if (expectedSize != 0)
            return invalidCompressedData();
        return QByteArray();
    }

    constexpr auto MaxDecompressedSize = size_t(QByteArray::maxSize());
    if constexpr (MaxDecompressedSize < std::numeric_limits<CompressSizeHint_t>::max()) {
        if (expectedSize > MaxDecompressedSize)
            return tooMuchData(ZLibOp::Decompression);
    }

    // expectedSize may be truncated, so always use at least nbytes
    // (larger by at most 1%, according to zlib docs)
    qsizetype capacity = std::max(qsizetype(expectedSize), // cannot overflow!
                                  nbytes);

    QArrayDataPointer<char> d(capacity);
    return xxflate(ZLibOp::Decompression, std::move(d), {data + HeaderSize, nbytes - HeaderSize},
                   [] (z_stream *zs) { return inflateInit(zs); },
                   [] (z_stream *zs, size_t) { return inflate(zs, Z_NO_FLUSH); },
                   [] (z_stream *zs) { inflateEnd(zs); });
}